

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O0

void __thiscall
CVmObjPattern::CVmObjPattern(CVmObjPattern *this,re_compiled_pattern *pat,vm_val_t *src_str)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  CVmObject *in_RDI;
  re_compiled_pattern *in_stack_ffffffffffffffd8;
  
  CVmObject::CVmObject(in_RDI);
  in_RDI->_vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_004482f0;
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,0x18,in_RDI);
  in_RDI->ext_ = (char *)CONCAT44(extraout_var,iVar1);
  set_orig_str((CVmObjPattern *)in_RDI,(vm_val_t *)in_stack_ffffffffffffffd8);
  set_pattern((CVmObjPattern *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

CVmObjPattern::CVmObjPattern(VMG_ re_compiled_pattern *pat,
                             const vm_val_t *src_str)
{
    /* allocate my extension data */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(sizeof(vmobj_pat_ext), this);

    /* remember my source data */
    set_orig_str(src_str);

    /* remember the compiled pattern */
    set_pattern(pat);
}